

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinFT98_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double rho_00;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double vt;
  double vl;
  double vs;
  double vr;
  double e;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    do {
      rho_00 = rho[uVar1];
      dVar3 = 0.0;
      dVar4 = 0.0;
      dVar2 = 0.0;
      dVar5 = 0.0;
      dVar6 = 0.0;
      if (1e-12 < rho_00) {
        dVar3 = 1.0000000000000042e-32;
        if (1.0000000000000042e-32 <= sigma[uVar1]) {
          dVar3 = sigma[uVar1];
        }
        dVar4 = 1e-20;
        if (1e-20 <= tau[uVar1]) {
          dVar4 = tau[uVar1];
        }
        dVar2 = rho_00 * 8.0 * dVar4;
        if (dVar3 <= dVar2) {
          dVar2 = dVar3;
        }
        kernel_traits<ExchCXX::BuiltinFT98_X>::eval_exc_vxc_unpolar_impl
                  (rho_00,dVar2,lapl[uVar1],dVar4,&local_38,&local_40,&local_48,&local_50,&local_58)
        ;
        dVar3 = local_50;
        dVar4 = local_58;
        dVar2 = local_48;
        dVar5 = local_40;
        dVar6 = local_38;
      }
      eps[uVar1] = dVar6 * scal_fact + eps[uVar1];
      vrho[uVar1] = dVar5 * scal_fact + vrho[uVar1];
      vsigma[uVar1] = dVar2 * scal_fact + vsigma[uVar1];
      vtau[uVar1] = dVar4 * scal_fact + vtau[uVar1];
      vlapl[uVar1] = dVar3 * scal_fact + vlapl[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}